

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feebumper_tests.cpp
# Opt level: O0

void wallet::feebumper::feebumper_tests::external_max_weight_test_invoker(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_wrap_stringstream<char> *msg;
  basic_wrap_stringstream<char> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  long in_FS_OFFSET;
  basic_wrap_stringstream<char> *in_stack_ffffffffffffecc8;
  std_string *in_stack_ffffffffffffecd0;
  basic_wrap_stringstream<char> *in_stack_ffffffffffffecd8;
  const_string *in_stack_ffffffffffffecf0;
  size_t in_stack_ffffffffffffecf8;
  undefined1 *__s;
  const_string *in_stack_ffffffffffffed00;
  const_string *file;
  unit_test_log_t *in_stack_ffffffffffffed08;
  external_max_weight_test *in_stack_ffffffffffffeec0;
  undefined1 local_fa8 [408];
  undefined1 local_e10 [408];
  undefined1 local_c78 [408];
  external_max_weight_test t;
  undefined1 local_1a0 [408];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecd8,
             (pointer)in_stack_ffffffffffffecd0,(unsigned_long)in_stack_ffffffffffffecc8);
  memset(local_1a0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_ffffffffffffecc8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_ffffffffffffecc8);
  boost::operator<<(in_stack_ffffffffffffecd8,(char *)in_stack_ffffffffffffecd0);
  boost::operator<<(in_stack_ffffffffffffecd8,(char (*) [25])in_stack_ffffffffffffecd0);
  boost::operator<<(in_stack_ffffffffffffecd8,(char (*) [15])in_stack_ffffffffffffecd0);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_ffffffffffffecd8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecd8,in_stack_ffffffffffffecd0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_ffffffffffffed08,in_stack_ffffffffffffed00,in_stack_ffffffffffffecf8,
             in_stack_ffffffffffffecf0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_ffffffffffffecc8);
  external_max_weight_test::external_max_weight_test
            ((external_max_weight_test *)in_stack_ffffffffffffecc8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecd8,
             (pointer)in_stack_ffffffffffffecd0,(unsigned_long)in_stack_ffffffffffffecc8);
  memset(local_c78,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_ffffffffffffecc8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_ffffffffffffecc8);
  boost::operator<<(in_stack_ffffffffffffecd8,(char *)in_stack_ffffffffffffecd0);
  boost::operator<<(in_stack_ffffffffffffecd8,(char (*) [25])in_stack_ffffffffffffecd0);
  boost::operator<<(in_stack_ffffffffffffecd8,(char (*) [16])in_stack_ffffffffffffecd0);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_ffffffffffffecd8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecd8,in_stack_ffffffffffffecd0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_ffffffffffffed08,in_stack_ffffffffffffed00,in_stack_ffffffffffffecf8,
             in_stack_ffffffffffffecf0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_ffffffffffffecc8);
  boost::unit_test::setup_conditional<wallet::feebumper::feebumper_tests::external_max_weight_test>
            ((external_max_weight_test *)0xda691d);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecd8,
             (pointer)in_stack_ffffffffffffecd0,(unsigned_long)in_stack_ffffffffffffecc8);
  memset(local_e10,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_ffffffffffffecc8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_ffffffffffffecc8);
  boost::operator<<(in_stack_ffffffffffffecd8,(char *)in_stack_ffffffffffffecd0);
  boost::operator<<(in_stack_ffffffffffffecd8,(char (*) [25])in_stack_ffffffffffffecd0);
  boost::operator<<(in_stack_ffffffffffffecd8,(char (*) [13])in_stack_ffffffffffffecd0);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_ffffffffffffecd8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecd8,in_stack_ffffffffffffecd0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_ffffffffffffed08,in_stack_ffffffffffffed00,in_stack_ffffffffffffecf8,
             in_stack_ffffffffffffecf0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_ffffffffffffecc8);
  external_max_weight_test::test_method(in_stack_ffffffffffffeec0);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecd8,
             (pointer)in_stack_ffffffffffffecd0,(unsigned_long)in_stack_ffffffffffffecc8);
  memset(local_fa8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_ffffffffffffecc8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_ffffffffffffecc8);
  boost::operator<<(in_stack_ffffffffffffecd8,(char *)in_stack_ffffffffffffecd0);
  boost::operator<<(in_stack_ffffffffffffecd8,(char (*) [25])in_stack_ffffffffffffecd0);
  boost::operator<<(in_stack_ffffffffffffecd8,(char (*) [19])in_stack_ffffffffffffecd0);
  this = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_ffffffffffffecd8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecd8,in_stack_ffffffffffffecd0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,in_stack_ffffffffffffed00,in_stack_ffffffffffffecf8,
             in_stack_ffffffffffffecf0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_ffffffffffffecc8);
  boost::unit_test::
  teardown_conditional<wallet::feebumper::feebumper_tests::external_max_weight_test>
            ((external_max_weight_test *)0xda6b67);
  file = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecd8,
             (pointer)in_stack_ffffffffffffecd0,(unsigned_long)in_stack_ffffffffffffecc8);
  __s = &stack0xffffffffffffeec0;
  memset(__s,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_ffffffffffffecc8);
  msg = boost::basic_wrap_stringstream<char>::ref(in_stack_ffffffffffffecc8);
  boost::operator<<(in_stack_ffffffffffffecd8,(char *)in_stack_ffffffffffffecd0);
  boost::operator<<(in_stack_ffffffffffffecd8,(char (*) [25])in_stack_ffffffffffffecd0);
  this_00 = boost::operator<<(in_stack_ffffffffffffecd8,(char (*) [15])in_stack_ffffffffffffecd0);
  s = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(this_00);
  boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00,s)
  ;
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,file,(size_t)__s,(const_string *)msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_ffffffffffffecc8);
  external_max_weight_test::~external_max_weight_test
            ((external_max_weight_test *)in_stack_ffffffffffffecc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(external_max_weight_test)
{
    // P2PKH
    CheckMaxWeightComputation("453042021f03c8957c5ce12940ee6e3333ecc3f633d9a1ac53a55b3ce0351c617fa96abe021f0dccdcce3ef45a63998be9ec748b561baf077b8e862941d0cd5ec08f5afe68012102fccfeb395f0ecd3a77e7bc31c3bc61dc987418b18e395d441057b42ca043f22c", {}, "76a914f60dcfd3392b28adc7662669603641f578eed72d88ac", 593);
    // P2SH-P2WPKH
    CheckMaxWeightComputation("160014001dca1b22c599b5a56a87c78417ad2ff39552f1", {"3042021f5443c58eaf45f3e5ef46f8516f966b334a7d497cedda4edb2b9fad57c90c3b021f63a77cb56cde848e2e2dd20b487eec2f53101f634193786083f60b4d23a82301", "026cfe86116f161057deb240201d6b82ebd4f161e0200d63dc9aca65a1d6b38bb7"}, "a9147c8ab5ad7708b97ccb6b483d57aba48ee85214df87", 364);
    // P2WPKH
    CheckMaxWeightComputation("", {"3042021f0f8906f0394979d5b737134773e5b88bf036c7d63542301d600ab677ba5a59021f0e9fe07e62c113045fa1c1532e2914720e8854d189c4f5b8c88f57956b704401", "0359edba11ed1a0568094a6296a16c4d5ee4c8cfe2f5e2e6826871b5ecf8188f79"}, "00149961a78658030cc824af4c54fbf5294bec0cabdd", 272);
    // P2WSH HTLC
    CheckMaxWeightComputation("", {"3042021f5c4c29e6b686aae5b6d0751e90208592ea96d26bc81d78b0d3871a94a21fa8021f74dc2f971e438ccece8699c8fd15704c41df219ab37b63264f2147d15c34d801", "01", "6321024cf55e52ec8af7866617dc4e7ff8433758e98799906d80e066c6f32033f685f967029000b275210214827893e2dcbe4ad6c20bd743288edad21100404eb7f52ccd6062fd0e7808f268ac"}, "002089e84892873c679b1129edea246e484fd914c2601f776d4f2f4a001eb8059703", 318);
}